

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O3

uint __thiscall Engine::getLocalFunctionNameByString(Engine *this,string *name)

{
  uint uVar1;
  size_t __n;
  int iVar2;
  size_type *psVar3;
  ulong uVar4;
  
  uVar1 = this->localFunctionsCount;
  if ((ulong)uVar1 != 0) {
    __n = name->_M_string_length;
    psVar3 = &this->localFunctionNames->_M_string_length;
    uVar4 = 0;
    do {
      if ((*psVar3 == __n) &&
         ((__n == 0 ||
          (iVar2 = bcmp((((string *)(psVar3 + -1))->_M_dataplus)._M_p,(name->_M_dataplus)._M_p,__n),
          iVar2 == 0)))) {
        return (uint)uVar4;
      }
      uVar4 = uVar4 + 1;
      psVar3 = psVar3 + 4;
    } while (uVar1 != uVar4);
  }
  return 0xffffffff;
}

Assistant:

unsigned int Engine::getLocalFunctionNameByString(std::string name) {
	unsigned int i;
	for (i = 0; i < this->localFunctionsCount; i++) {
		if (this->localFunctionNames[i] == name) {
			return i;
		}
	}
	return CANT_FIND;
}